

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

bool ON_XMLNodePrivate::AssertValidTag(ON_wString *tag)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ON_wString sEsc;
  ON_wString OStack_28;
  
  uVar2 = ON_wString::Count(tag,L'\"');
  if ((uVar2 & 1) == 0) {
    iVar3 = ON_wString::Count(tag,L'<');
    iVar4 = ON_wString::Count(tag,L'>');
    iVar5 = 0;
    if (iVar3 == iVar4) {
      do {
        iVar3 = ON_wString::Find(tag,L'&',iVar5);
        if (-1 < iVar3) {
          iVar5 = ON_wString::Find(tag,L';',iVar3);
          if (iVar5 < 0) goto LAB_006920f7;
          ON_wString::Mid(&OStack_28,(int)tag,iVar3);
          bVar1 = ON_wString::IsXMLSpecialCharacterEncoding(&OStack_28);
          ON_wString::~ON_wString(&OStack_28);
          if (!bVar1) goto LAB_006920f7;
          iVar5 = iVar3 + 1;
        }
      } while (-1 < iVar3);
      iVar5 = 1;
    }
  }
  else {
LAB_006920f7:
    iVar5 = 0;
  }
  return SUB41(iVar5,0);
}

Assistant:

bool ON_XMLNodePrivate::AssertValidTag(const ON_wString& tag) // Static.
{
  // Check for an even number of quotes - odd means there are quotes in the strings.
  const int quoteCount = tag.Count(L'\"');

  if ((quoteCount % 2) != 0)
  {
    // Odd number of quotes; fail.
    OUTPUT_DEBUG_STRING_EOL(L"Odd number of quotes");
    return false;
  }

  if (tag.Count(L'<') != tag.Count(L'>'))
  {
    OUTPUT_DEBUG_STRING_EOL(L"Bad tag format; even on nested tags, < and > should be equal");
    return false;
  }

  // Check for lone ampersands.
  int pos = 0;
  int find = -1;
  do
  {
    find = tag.Find(L'&', pos);
    if (find >= 0)
    {
      pos = find + 1;
      const int semicolon = tag.Find(L';', find);
      if (semicolon < 0)
      {
        OUTPUT_DEBUG_STRING_EOL(L"Unterminated entity reference");
        return false;
      }

      const auto sEsc = tag.Mid(pos - 1, semicolon - pos + 2);
      if (!sEsc.IsXMLSpecialCharacterEncoding())
      {
        OUTPUT_DEBUG_STRING_EOL(L"Malformed tag on read");
        return false;
      }
    }
  }
  while (find >= 0);

  return true;
}